

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

bool MeCab::toLower(string *s)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  
  if (s->_M_string_length != 0) {
    uVar3 = 0;
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      bVar1 = pcVar2[uVar3];
      if ((byte)(bVar1 + 0xbf) < 0x1a) {
        pcVar2[uVar3] = bVar1 | 0x20;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < s->_M_string_length);
  }
  return true;
}

Assistant:

bool toLower(std::string *s) {
  for (size_t i = 0; i < s->size(); ++i) {
    char c = (*s)[i];
    if ((c >= 'A') && (c <= 'Z')) {
      c += 'a' - 'A';
      (*s)[i] = c;
    }
  }
  return true;
}